

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastUmS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte *p;
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ushort *puVar5;
  ulong uVar6;
  char *pcVar7;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 arena;
  ParseContext *pPVar9;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  size_t size;
  TcParseTableBase *ptr_00;
  TcParseTableBase *pTVar10;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 this;
  ulong uVar11;
  TcParseTableBase *pTVar12;
  uint *puVar13;
  string_view data_00;
  pair<const_char_*,_int> pVar14;
  string_view sVar15;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar7 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  this.data = (long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30);
  if ((this.data & 7) != 0) {
    AlignFail(this.data);
  }
  p = (byte *)(ptr + 1);
  uVar11 = (ulong)data.field_0 >> 0x10;
  arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
  if ((arena.data & 1) != 0) {
    arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
            ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(arena.data & 0xfffffffffffffffe))->data;
  }
  bVar1 = *ptr;
  bVar2 = *p;
  ptr_00 = (TcParseTableBase *)(ulong)bVar2;
  uVar4 = (uint)bVar2;
  pPVar9 = ctx;
  if (arena.data == 0) {
    if ((char)bVar2 < '\0') {
      pVar14 = ReadSizeFallback((char *)p,(uint)bVar2);
      pPVar9 = pVar14._8_8_;
      pTVar12 = (TcParseTableBase *)pVar14.first;
      uVar4 = pVar14.second;
    }
    else {
      pTVar12 = (TcParseTableBase *)(ptr + 2);
      ptr_00 = (TcParseTableBase *)ptr;
    }
    if (pTVar12 == (TcParseTableBase *)0x0) {
      puVar5 = (ushort *)0x0;
      arena = data.field_0;
    }
    else {
      iVar3 = EpsCopyInputStream::BytesAvailable(&ctx->super_EpsCopyInputStream,(char *)pTVar12);
      if (iVar3 < (int)uVar4) {
        arena.data = this.data;
        puVar5 = (ushort *)
                 EpsCopyInputStream::ReadMicroStringFallback
                           (&ctx->super_EpsCopyInputStream,(char *)pTVar12,uVar4,(MicroString *)this
                            ,(Arena *)0x0);
        pPVar9 = extraout_RDX_01;
        ptr_00 = pTVar12;
      }
      else {
        pTVar10 = (TcParseTableBase *)(long)(int)uVar4;
        arena.data = 0;
        sVar15._M_str = (char *)pTVar12;
        sVar15._M_len = (size_t)pTVar10;
        ptr_00 = pTVar10;
        MicroString::SetImpl((MicroString *)this,sVar15,(Arena *)0x0,7);
        puVar5 = (ushort *)((long)&pTVar10->has_bits_offset + (long)&pTVar12->has_bits_offset);
        pPVar9 = extraout_RDX_02;
      }
    }
  }
  else {
    if ((char)bVar2 < '\0') {
      pVar14 = ReadSizeFallback((char *)p,(uint)bVar2);
      pPVar9 = pVar14._8_8_;
      pTVar12 = (TcParseTableBase *)pVar14.first;
      uVar4 = pVar14.second;
    }
    else {
      pTVar12 = (TcParseTableBase *)(ptr + 2);
      ptr_00 = (TcParseTableBase *)ptr;
    }
    if (pTVar12 == (TcParseTableBase *)0x0) {
      puVar5 = (ushort *)0x0;
      arena = data.field_0;
    }
    else {
      iVar3 = EpsCopyInputStream::BytesAvailable(&ctx->super_EpsCopyInputStream,(char *)pTVar12);
      if (iVar3 < (int)uVar4) {
        aVar8.data = this.data;
        puVar5 = (ushort *)
                 EpsCopyInputStream::ReadMicroStringFallback
                           (&ctx->super_EpsCopyInputStream,(char *)pTVar12,uVar4,(MicroString *)this
                            ,(Arena *)arena);
        arena = aVar8;
        pPVar9 = extraout_RDX;
        ptr_00 = pTVar12;
      }
      else {
        pTVar10 = (TcParseTableBase *)(long)(int)uVar4;
        data_00._M_str = (char *)pTVar12;
        data_00._M_len = (size_t)pTVar10;
        ptr_00 = pTVar10;
        MicroString::SetImpl((MicroString *)this,data_00,(Arena *)arena,7);
        puVar5 = (ushort *)((long)&pTVar10->has_bits_offset + (long)&pTVar12->has_bits_offset);
        pPVar9 = extraout_RDX_00;
      }
    }
  }
  uVar11 = hasbits | 1L << (uVar11 & 0x3f);
  if (puVar5 != (ushort *)0x0) {
    sVar15 = MicroString::Get((MicroString *)this);
    iVar3 = utf8_range_IsValid(sVar15._M_str,sVar15._M_len);
    if (iVar3 != 0) {
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar5) {
        if ((ulong)table->has_bits_offset != 0) {
          puVar13 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
          if (((ulong)puVar13 & 3) != 0) {
            AlignFail(puVar13);
          }
          *puVar13 = *puVar13 | (uint)uVar11;
        }
        return (char *)puVar5;
      }
      uVar4 = (uint)table->fast_idx_mask & (uint)*puVar5;
      if ((uVar4 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar6 = (ulong)(uVar4 & 0xfffffff8);
      pcVar7 = (char *)(**(code **)(&table[1].has_bits_offset + uVar6))
                                 (msg,puVar5,ctx,
                                  (ulong)*puVar5 ^ *(ulong *)(&table[1].fast_idx_mask + uVar6 * 2),
                                  table,uVar11);
      return pcVar7;
    }
    ptr_00 = table;
    ReportFastUtf8Error((uint)bVar1,table);
    pPVar9 = extraout_RDX_03;
  }
  pcVar7 = Error(msg,(char *)ptr_00,pPVar9,(TcFieldData)arena,table,uVar11);
  return pcVar7;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastUmS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint8_t, MicroString, kUtf8>(
      PROTOBUF_TC_PARAM_PASS);
}